

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmt_bin_decode_nvidia.c
# Opt level: O0

uint load_memory_dump(uint pfx,mmt_memory_dump_prefix **dump,mmt_buf **buf,
                     mmt_nvidia_decode_funcs *funcs)

{
  uint sz;
  uint sz_00;
  char *pcVar1;
  void *pvVar2;
  mmt_memory_dump_prefix *pmVar3;
  mmt_buf *pmVar4;
  uint local_5c;
  uint omit;
  mmt_message *msg;
  mmt_message_nv *nv;
  mmt_buf *b;
  mmt_memory_dump_prefix *d;
  uint omitted;
  uint size2;
  uint size1;
  mmt_nvidia_decode_funcs *funcs_local;
  mmt_buf **buf_local;
  mmt_memory_dump_prefix **dump_local;
  uint pfx_local;
  
  d._4_4_ = 0;
  *dump = (mmt_memory_dump_prefix *)0x0;
  *buf = (mmt_buf *)0x0;
  dump_local._0_4_ = pfx;
  do {
    pcVar1 = (char *)mmt_load_data_with_prefix(1,(uint)dump_local,1);
    if ((pcVar1 == (char *)0x0) || (*pcVar1 != 'n')) {
      return 0;
    }
    mmt_load_data_with_prefix(2,(uint)dump_local,0);
    pvVar2 = mmt_load_data_with_prefix(2,(uint)dump_local,0);
    if (pvVar2 == (void *)0x0) {
      return 0;
    }
    if (*(char *)((long)pvVar2 + 1) != 'o') {
      if ((*(char *)((long)pvVar2 + 1) == 'c') &&
         (funcs->create_object == (_func_void_mmt_nvidia_create_object_ptr_void_ptr *)0x0)) {
        local_5c = load_create_object((mmt_nvidia_create_object **)0x0,(uint)dump_local);
      }
      else if ((*(char *)((long)pvVar2 + 1) == 'd') &&
              (funcs->destroy_object == (_func_void_mmt_nvidia_destroy_object_ptr_void_ptr *)0x0)) {
        local_5c = load_destroy_object((mmt_nvidia_destroy_object **)0x0,(uint)dump_local);
      }
      else if ((*(char *)((long)pvVar2 + 1) == 'l') &&
              (funcs->call_method == (_func_void_mmt_nvidia_call_method_ptr_void_ptr *)0x0)) {
        local_5c = load_call_method((mmt_nvidia_call_method **)0x0,(uint)dump_local);
      }
      else if ((*(char *)((long)pvVar2 + 1) == 'p') &&
              (funcs->create_mapped ==
               (_func_void_mmt_nvidia_create_mapped_object_ptr_void_ptr *)0x0)) {
        local_5c = load_create_mapped_object
                             ((mmt_nvidia_create_mapped_object **)0x0,(uint)dump_local);
      }
      else if ((*(char *)((long)pvVar2 + 1) == 't') &&
              (funcs->create_dma_object ==
               (_func_void_mmt_nvidia_create_dma_object_ptr_void_ptr *)0x0)) {
        local_5c = load_create_dma_object((mmt_nvidia_create_dma_object **)0x0,(uint)dump_local);
      }
      else if ((*(char *)((long)pvVar2 + 1) == 'a') &&
              (funcs->alloc_map == (_func_void_mmt_nvidia_alloc_map_ptr_void_ptr *)0x0)) {
        local_5c = load_alloc_map((mmt_nvidia_alloc_map **)0x0,(uint)dump_local);
      }
      else if ((*(char *)((long)pvVar2 + 1) == 'g') &&
              (funcs->gpu_map == (_func_void_mmt_nvidia_gpu_map_ptr_void_ptr *)0x0)) {
        local_5c = load_gpu_map((mmt_nvidia_gpu_map **)0x0,(uint)dump_local);
      }
      else if ((*(char *)((long)pvVar2 + 1) == 'G') &&
              (funcs->gpu_map2 == (_func_void_mmt_nvidia_gpu_map2_ptr_void_ptr *)0x0)) {
        local_5c = load_gpu_map2((mmt_nvidia_gpu_map2 **)0x0,(uint)dump_local);
      }
      else if ((*(char *)((long)pvVar2 + 1) == 'h') &&
              (funcs->gpu_unmap == (_func_void_mmt_nvidia_gpu_unmap_ptr_void_ptr *)0x0)) {
        local_5c = load_gpu_unmap((mmt_nvidia_gpu_unmap **)0x0,(uint)dump_local);
      }
      else if ((*(char *)((long)pvVar2 + 1) == 'H') &&
              (funcs->gpu_unmap2 == (_func_void_mmt_nvidia_gpu_unmap2_ptr_void_ptr *)0x0)) {
        local_5c = load_gpu_unmap2((mmt_nvidia_gpu_unmap2 **)0x0,(uint)dump_local);
      }
      else if (*(char *)((long)pvVar2 + 1) == 'm') {
        local_5c = load_mmap((mmt_nvidia_mmap **)0x0,(uint)dump_local);
      }
      else if ((*(char *)((long)pvVar2 + 1) == 'e') &&
              (funcs->unmap == (_func_void_mmt_nvidia_unmap_ptr_void_ptr *)0x0)) {
        local_5c = load_unmap((mmt_nvidia_unmap **)0x0,(uint)dump_local);
      }
      else if ((*(char *)((long)pvVar2 + 1) == 'b') &&
              (funcs->bind == (_func_void_mmt_nvidia_bind_ptr_void_ptr *)0x0)) {
        local_5c = load_bind((mmt_nvidia_bind **)0x0,(uint)dump_local);
      }
      else if ((*(char *)((long)pvVar2 + 1) == 'r') &&
              (funcs->create_driver_object ==
               (_func_void_mmt_nvidia_create_driver_object_ptr_void_ptr *)0x0)) {
        local_5c = load_create_driver_object
                             ((mmt_nvidia_create_driver_object **)0x0,(uint)dump_local);
      }
      else if ((*(char *)((long)pvVar2 + 1) == 'v') &&
              (funcs->create_device_object ==
               (_func_void_mmt_nvidia_create_device_object_ptr_void_ptr *)0x0)) {
        local_5c = load_create_device_object
                             ((mmt_nvidia_create_device_object **)0x0,(uint)dump_local);
      }
      else {
        if ((*(char *)((long)pvVar2 + 1) != 'x') ||
           (funcs->create_context_object !=
            (_func_void_mmt_nvidia_create_context_object_ptr_void_ptr *)0x0)) {
          return 0;
        }
        local_5c = load_create_context_object
                             ((mmt_nvidia_create_context_object **)0x0,(uint)dump_local);
      }
      d._4_4_ = local_5c + d._4_4_;
      dump_local._0_4_ = local_5c + (uint)dump_local;
    }
    if (*(char *)((long)pvVar2 + 1) == 'o') {
      pvVar2 = mmt_load_data_with_prefix(0xe,(uint)dump_local,0);
      mmt_buf_check_sanity((mmt_buf *)((long)pvVar2 + 10));
      sz = *(int *)((long)pvVar2 + 10) + 0xe;
      pmVar3 = (mmt_memory_dump_prefix *)mmt_load_data_with_prefix(sz,(uint)dump_local,0);
      pmVar4 = (mmt_buf *)mmt_load_data_with_prefix(4,sz + (uint)dump_local,0);
      mmt_buf_check_sanity(pmVar4);
      sz_00 = pmVar4->len + 5;
      pmVar4 = (mmt_buf *)mmt_load_data_with_prefix(sz_00,sz + (uint)dump_local,0);
      mmt_check_eor(sz_00 + sz + (uint)dump_local);
      *dump = pmVar3;
      *buf = pmVar4;
      return sz + sz_00 + d._4_4_;
    }
  } while( true );
}

Assistant:

static unsigned int load_memory_dump(unsigned int pfx, struct mmt_memory_dump_prefix **dump,
		struct mmt_buf **buf, struct mmt_nvidia_decode_funcs *funcs)
{
	unsigned int size1, size2, omitted = 0;
	struct mmt_memory_dump_prefix *d;
	struct mmt_buf *b;
	*dump = NULL;
	*buf = NULL;
	struct mmt_message_nv *nv;

	do
	{
		struct mmt_message *msg = mmt_load_data_with_prefix(1, pfx, 1);
		if (msg == NULL || msg->type != 'n')
			return 0;

		mmt_load_data_with_prefix(sizeof(struct mmt_message_nv), pfx, 0);

		nv = mmt_load_data_with_prefix(sizeof(struct mmt_message_nv), pfx, 0);
		if (nv == NULL)
			return 0;

		if (nv->subtype != 'o')
		{
			unsigned int omit;
			if (nv->subtype == 'c' && funcs->create_object == NULL)
				omit = load_create_object(NULL, pfx);
			else if (nv->subtype == 'd' && funcs->destroy_object == NULL)
				omit = load_destroy_object(NULL, pfx);
			else if (nv->subtype == 'l' && funcs->call_method == NULL)
				omit = load_call_method(NULL, pfx);
			else if (nv->subtype == 'p' && funcs->create_mapped == NULL)
				omit = load_create_mapped_object(NULL, pfx);
			else if (nv->subtype == 't' && funcs->create_dma_object == NULL)
				omit = load_create_dma_object(NULL, pfx);
			else if (nv->subtype == 'a' && funcs->alloc_map == NULL)
				omit = load_alloc_map(NULL, pfx);
			else if (nv->subtype == 'g' && funcs->gpu_map == NULL)
				omit = load_gpu_map(NULL, pfx);
			else if (nv->subtype == 'G' && funcs->gpu_map2 == NULL)
				omit = load_gpu_map2(NULL, pfx);
			else if (nv->subtype == 'h' && funcs->gpu_unmap == NULL)
				omit = load_gpu_unmap(NULL, pfx);
			else if (nv->subtype == 'H' && funcs->gpu_unmap2 == NULL)
				omit = load_gpu_unmap2(NULL, pfx);
			else if (nv->subtype == 'm' /*&& funcs->mmap == NULL*/)
				omit = load_mmap(NULL, pfx);
			else if (nv->subtype == 'e' && funcs->unmap == NULL)
				omit = load_unmap(NULL, pfx);
			else if (nv->subtype == 'b' && funcs->bind == NULL)
				omit = load_bind(NULL, pfx);
			else if (nv->subtype == 'r' && funcs->create_driver_object == NULL)
				omit = load_create_driver_object(NULL, pfx);
			else if (nv->subtype == 'v' && funcs->create_device_object == NULL)
				omit = load_create_device_object(NULL, pfx);
			else if (nv->subtype == 'x' && funcs->create_context_object == NULL)
				omit = load_create_context_object(NULL, pfx);
			else
			{
				//if (nv->subtype != 'j' && nv->subtype != 'i')
				//	printf("%d '%c'\n", nv->subtype, nv->subtype);
				return 0;
			}

			omitted += omit;
			pfx += omit;
		}
	}
	while (nv->subtype != 'o');

	size1 = sizeof(struct mmt_memory_dump_prefix);
	d = mmt_load_data_with_prefix(size1, pfx, 0);
	mmt_buf_check_sanity(&d->str);
	size1 += d->str.len;
	d = mmt_load_data_with_prefix(size1, pfx, 0);

	size2 = 4;
	b = mmt_load_data_with_prefix(size2, size1 + pfx, 0);
	mmt_buf_check_sanity(b);
	size2 += b->len + 1;
	b = mmt_load_data_with_prefix(size2, size1 + pfx, 0);

	mmt_check_eor(size2 + size1 + pfx);

	*dump = d;
	*buf = b;

	return size1 + size2 + omitted;
}